

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O3

OPJ_UINT32 opj_bio_read(opj_bio_t *bio,OPJ_UINT32 n)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  OPJ_UINT32 OVar6;
  
  if (n == 0) {
    __assert_fail("(n > 0U)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/bio.c"
                  ,0xae,"OPJ_UINT32 opj_bio_read(opj_bio_t *, OPJ_UINT32)");
  }
  if ((int)n < 1) {
    uVar3 = 0;
  }
  else {
    uVar4 = bio->buf;
    OVar6 = bio->ct;
    uVar5 = n + 1;
    uVar3 = 0;
    do {
      if (OVar6 == 0) {
        uVar2 = uVar4 & 0xff;
        uVar4 = uVar2 << 8;
        bio->buf = uVar4;
        OVar6 = (uVar2 != 0xff) + 7;
        bio->ct = OVar6;
        pbVar1 = bio->bp;
        if (pbVar1 < bio->end) {
          bio->bp = pbVar1 + 1;
          uVar4 = uVar4 | *pbVar1;
          bio->buf = uVar4;
        }
      }
      OVar6 = OVar6 - 1;
      bio->ct = OVar6;
      uVar3 = uVar3 | (uint)((uVar4 >> (OVar6 & 0x1f) & 1) != 0) << ((char)uVar5 - 2U & 0x1f);
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
  }
  return uVar3;
}

Assistant:

OPJ_UINT32 opj_bio_read(opj_bio_t *bio, OPJ_UINT32 n)
{
    OPJ_INT32 i;
    OPJ_UINT32 v;

    assert((n > 0U) /* && (n <= 32U)*/);
#ifdef OPJ_UBSAN_BUILD
    /* This assert fails for some corrupted images which are gracefully rejected */
    /* Add this assert only for ubsan build. */
    /* This is the condition for overflow not to occur below which is needed because of OPJ_NOSANITIZE */
    assert(n <= 32U);
#endif
    v = 0U;
    for (i = (OPJ_INT32)n - 1; i >= 0; i--) {
        v |= opj_bio_getbit(bio) <<
             i; /* can't overflow, opj_bio_getbit returns 0 or 1 */
    }
    return v;
}